

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int la_strntouint16_t(char *txt,int charcnt)

{
  int iVar1;
  size_t sVar2;
  int in_ESI;
  char *in_RDI;
  int i;
  int j;
  int base;
  int ret;
  int local_24;
  int local_1c;
  int local_18;
  
  if ((((in_RDI != (char *)0x0) && (0 < in_ESI)) && (in_ESI < 10)) &&
     (sVar2 = strnlen(in_RDI,(long)in_ESI), (ulong)(long)in_ESI <= sVar2)) {
    local_18 = 0;
    local_1c = 1;
    local_24 = 0;
    while( true ) {
      if (in_ESI <= local_24) {
        return local_18;
      }
      iVar1 = (in_ESI + -1) - local_24;
      if ((in_RDI[iVar1] < '0') || ('9' < in_RDI[iVar1])) break;
      local_18 = (in_RDI[iVar1] + -0x30) * local_1c + local_18;
      local_1c = local_1c * 10;
      local_24 = local_24 + 1;
    }
    return -2;
  }
  return -1;
}

Assistant:

int la_strntouint16_t(char const *txt, int charcnt) {
	if(txt == NULL ||
			charcnt < 1 ||
			charcnt > 9 ||      // prevent overflowing int
			strnlen(txt, charcnt) < (size_t)charcnt)
	{
		return -1;
	}
	int ret = 0;
	int base = 1;
	int j;
	for(int i = 0; i < charcnt; i++) {
		j = charcnt - 1 - i;
		if(txt[j] < '0' || txt[j] > '9') {
			return -2;
		}
		ret += (txt[j] - '0') * base;
		base *= 10;
	}
	return ret;
}